

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManFromIfLogicCofVars
              (Gia_Man_t *pNew,If_Man_t *pIfMan,If_Cut_t *pCutBest,Vec_Int_t *vLeaves,
              Vec_Int_t *vLeaves2,Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2)

{
  uint uVar1;
  char cVar2;
  uint nVars;
  int iVar3;
  int iVar4;
  int iVar5;
  int Entry;
  word *pIn;
  Gia_Obj_t *pObj;
  int local_4bc;
  int local_4b8;
  int RetValue;
  int k;
  int iTopLit;
  int iTemp;
  int iVar;
  int c;
  int truthId;
  int nWords;
  int nLeaves;
  int iLitCofs [3];
  int nVarsNew;
  int pVarsNew [16];
  word *pTruth;
  word pTruthCof [128];
  Vec_Int_t *vCover_local;
  Vec_Int_t *vLeaves2_local;
  Vec_Int_t *vLeaves_local;
  If_Cut_t *pCutBest_local;
  If_Man_t *pIfMan_local;
  Gia_Man_t *pNew_local;
  
  pTruthCof[0x7f] = (word)vCover;
  pIn = If_CutTruthW(pIfMan,pCutBest);
  nVars = *(uint *)&pCutBest->field_0x1c >> 0x18;
  iVar3 = Abc_Truth6WordNum(nVars);
  iVar4 = Abc_Lit2Var(pCutBest->iCutFunc);
  cVar2 = Vec_StrEntry(pIfMan->vTtVars[(int)nVars],iVar4);
  iVar4 = (int)cVar2;
  if (((iVar4 < 0) || ((int)nVars <= iVar4)) || (0xd < pIfMan->pPars->nLutSize)) {
    __assert_fail("iVar >= 0 && iVar < nLeaves && pIfMan->pPars->nLutSize <= 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x650,
                  "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  for (iTemp = 0; iTemp < 2; iTemp = iTemp + 1) {
    for (local_4b8 = 0; local_4b8 < (int)nVars; local_4b8 = local_4b8 + 1) {
      iLitCofs[(long)local_4b8 + 2] = local_4b8;
    }
    if (iTemp == 0) {
      Abc_TtCofactor0p((word *)&pTruth,pIn,iVar3,iVar4);
    }
    else {
      Abc_TtCofactor1p((word *)&pTruth,pIn,iVar3,iVar4);
    }
    uVar1 = *(uint *)&pCutBest->field_0x1c;
    iVar5 = Abc_MaxInt(6,*(uint *)&pCutBest->field_0x1c >> 0x18);
    iLitCofs[1] = Abc_TtMinBase((word *)&pTruth,iLitCofs + 2,uVar1 >> 0x18,iVar5);
    Vec_IntClear(vLeaves2);
    for (local_4b8 = 0; local_4b8 < iLitCofs[1]; local_4b8 = local_4b8 + 1) {
      iVar5 = Vec_IntEntry(vLeaves,iLitCofs[(long)local_4b8 + 2]);
      Vec_IntPush(vLeaves2,iVar5);
    }
    iVar5 = Kit_TruthToGia(pNew,(uint *)&pTruth,iLitCofs[1],(Vec_Int_t *)pTruthCof[0x7f],vLeaves2,0)
    ;
    (&nWords)[iTemp] = iVar5;
    if (1 < iLitCofs[1]) {
      iVar5 = Abc_Lit2Var((&nWords)[iTemp]);
      pObj = Gia_ManObj(pNew,iVar5);
      iVar5 = Gia_ObjIsAnd(pObj);
      if (iVar5 == 0) {
        __assert_fail("Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c])))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x662,
                      "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar5 = Abc_Lit2Var((&nWords)[iTemp]);
      Entry = Vec_IntSize(vMapping2);
      Vec_IntSetEntry(vMapping,iVar5,Entry);
      iVar5 = Vec_IntSize(vLeaves2);
      Vec_IntPush(vMapping2,iVar5);
      for (local_4b8 = 0; iVar5 = Vec_IntSize(vLeaves2), local_4b8 < iVar5;
          local_4b8 = local_4b8 + 1) {
        iVar5 = Vec_IntEntry(vLeaves2,local_4b8);
        iVar5 = Abc_Lit2Var(iVar5);
        Vec_IntPush(vMapping2,iVar5);
      }
      iVar5 = Abc_Lit2Var((&nWords)[iTemp]);
      Vec_IntPush(vMapping2,iVar5);
    }
  }
  iLitCofs[0] = Vec_IntEntry(vLeaves,iVar4);
  if ((nWords < 2) || (nLeaves < 2)) {
    if ((nWords < 2) && (nLeaves < 2)) {
      __assert_fail("iLitCofs[0] > 1 || iLitCofs[1] > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x677,
                    "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    Vec_IntClear(vLeaves2);
    for (local_4b8 = 0; local_4b8 < 3; local_4b8 = local_4b8 + 1) {
      if (1 < (&nWords)[local_4b8]) {
        Vec_IntPush(vLeaves2,(&nWords)[local_4b8]);
      }
    }
    iVar3 = Vec_IntSize(vLeaves2);
    if (iVar3 != 2) {
      __assert_fail("Vec_IntSize(vLeaves2) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x67d,
                    "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (nWords == 0) {
      local_4bc = Gia_ManAppendAnd(pNew,iLitCofs[0],nLeaves);
    }
    else if (nWords == 1) {
      iVar3 = Abc_LitNot(iLitCofs[0]);
      local_4bc = Gia_ManAppendOr(pNew,iVar3,nLeaves);
    }
    else if (nLeaves == 0) {
      iVar3 = Abc_LitNot(iLitCofs[0]);
      local_4bc = Gia_ManAppendAnd(pNew,iVar3,nWords);
    }
    else {
      if (nLeaves != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x687,
                      "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      local_4bc = Gia_ManAppendOr(pNew,iLitCofs[0],nWords);
    }
    RetValue = iLitCofs[0];
  }
  else {
    pTruth = (word *)0xcacacacacacacaca;
    Vec_IntClear(vLeaves2);
    Vec_IntPush(vLeaves2,nWords);
    Vec_IntPush(vLeaves2,nLeaves);
    Vec_IntPush(vLeaves2,iLitCofs[0]);
    iVar3 = Vec_IntSize(vLeaves2);
    local_4bc = Kit_TruthToGia(pNew,(uint *)&pTruth,iVar3,(Vec_Int_t *)pTruthCof[0x7f],vLeaves2,0);
    RetValue = local_4bc;
  }
  iVar3 = Abc_Lit2Var(local_4bc);
  iVar4 = Vec_IntSize(vMapping2);
  Vec_IntSetEntry(vMapping,iVar3,iVar4);
  iVar3 = Vec_IntSize(vLeaves2);
  Vec_IntPush(vMapping2,iVar3);
  for (local_4b8 = 0; iVar3 = Vec_IntSize(vLeaves2), local_4b8 < iVar3; local_4b8 = local_4b8 + 1) {
    iVar3 = Vec_IntEntry(vLeaves2,local_4b8);
    iVar3 = Abc_Lit2Var(iVar3);
    Vec_IntPush(vMapping2,iVar3);
  }
  iVar3 = Abc_Lit2Var(RetValue);
  Vec_IntPush(vMapping2,-iVar3);
  iVar3 = Abc_LitNotCond(local_4bc,*(uint *)&pCutBest->field_0x1c >> 0xc & 1);
  return iVar3;
}

Assistant:

int Gia_ManFromIfLogicCofVars( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Cut_t * pCutBest, Vec_Int_t * vLeaves, Vec_Int_t * vLeaves2, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2 )
{
    word pTruthCof[128], * pTruth = If_CutTruthW(pIfMan, pCutBest);
    int pVarsNew[16], nVarsNew, iLitCofs[3]; 
    int nLeaves = pCutBest->nLeaves;
    int nWords  = Abc_Truth6WordNum(nLeaves);
    int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
    int c, iVar = Vec_StrEntry(pIfMan->vTtVars[nLeaves], truthId), iTemp, iTopLit;
    int k, RetValue = -1;
    assert( iVar >= 0 && iVar < nLeaves && pIfMan->pPars->nLutSize <= 13 );
    for ( c = 0; c < 2; c++ )
    {
        for ( k = 0; k < nLeaves; k++ )
            pVarsNew[k] = k;
        if ( c )
            Abc_TtCofactor1p( pTruthCof, pTruth, nWords, iVar );
        else
            Abc_TtCofactor0p( pTruthCof, pTruth, nWords, iVar );
        nVarsNew = Abc_TtMinBase( pTruthCof, pVarsNew, pCutBest->nLeaves, Abc_MaxInt(6, pCutBest->nLeaves) );
        // derive LUT
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < nVarsNew; k++ )
            Vec_IntPush( vLeaves2, Vec_IntEntry(vLeaves, pVarsNew[k]) );
        iLitCofs[c] = Kit_TruthToGia( pNew, (unsigned *)pTruthCof, nVarsNew, vCover, vLeaves2, 0 );
        if ( nVarsNew < 2 )
            continue;
        // create mapping
        assert( Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c]))) );
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitCofs[c]), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
        Vec_IntForEachEntry( vLeaves2, iTemp, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[c]) );
    }
    iLitCofs[2]  = Vec_IntEntry(vLeaves, iVar);
    // derive MUX
    if ( iLitCofs[0] > 1 && iLitCofs[1] > 1 )
    {
        pTruthCof[0] = ABC_CONST(0xCACACACACACACACA);
        Vec_IntClear( vLeaves2 );
        Vec_IntPush( vLeaves2, iLitCofs[0] );
        Vec_IntPush( vLeaves2, iLitCofs[1] );
        Vec_IntPush( vLeaves2, iLitCofs[2] );
        RetValue = Kit_TruthToGia( pNew, (unsigned *)pTruthCof, Vec_IntSize(vLeaves2), vCover, vLeaves2, 0 );
        iTopLit = RetValue;
    }
    else
    {
        assert( iLitCofs[0] > 1 || iLitCofs[1] > 1 );
        // collect leaves
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < 3; k++ )
            if ( iLitCofs[k] > 1 )
                Vec_IntPush( vLeaves2, iLitCofs[k] );
        assert( Vec_IntSize(vLeaves2) == 2 );
        // consider three possibilities
        if ( iLitCofs[0] == 0 )
            RetValue = Gia_ManAppendAnd( pNew, iLitCofs[2], iLitCofs[1] );
        else if ( iLitCofs[0] == 1 )
            RetValue = Gia_ManAppendOr( pNew, Abc_LitNot(iLitCofs[2]), iLitCofs[1] );
        else if ( iLitCofs[1] == 0 )
            RetValue = Gia_ManAppendAnd( pNew, Abc_LitNot(iLitCofs[2]), iLitCofs[0] );
        else if ( iLitCofs[1] == 1 )
            RetValue = Gia_ManAppendOr( pNew, iLitCofs[2], iLitCofs[0] );
        else assert( 0 );
        iTopLit = iLitCofs[2];
    }
    // create mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(RetValue), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
    Vec_IntForEachEntry( vLeaves2, iTemp, k )
        Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
    Vec_IntPush( vMapping2, -Abc_Lit2Var(iTopLit) );
    RetValue = Abc_LitNotCond( RetValue, pCutBest->fCompl );
    return RetValue;
}